

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O3

void __thiscall
adios2::helper::(anonymous_namespace)::SetOption<std::__cxx11::string>
          (_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,string nodeName,
          Node *upperNode,string *hint,bool mandatory)

{
  undefined7 in_register_00000081;
  bool in_R9B;
  Node node;
  string local_b8;
  as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_98;
  string local_90;
  Node local_70;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,value,&upperNode->m_isValid + (long)&(value->_M_dataplus)._M_p);
  anon_unknown_0::YAMLNode
            (&local_70,&local_b8,(Node *)hint,(string *)CONCAT71(in_register_00000081,mandatory),
             in_R9B,Scalar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((local_70.m_isValid == true) &&
     ((local_70.m_pNode == (node *)0x0 ||
      ((((((local_70.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    local_98.node = &local_70;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()(&local_90,&local_98);
    std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if (local_70.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_invalidKey._M_dataplus._M_p != &local_70.m_invalidKey.field_2) {
    operator_delete(local_70.m_invalidKey._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}